

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintSExpression::maybePrintImplicitBlock(PrintSExpression *this,Expression *curr)

{
  bool bVar1;
  Block *pBVar2;
  Expression **ppEVar3;
  Expression *expression;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Block *block;
  Expression *curr_local;
  PrintSExpression *this_local;
  
  pBVar2 = Expression::dynCast<wasm::Block>(curr);
  if ((((this->full & 1U) == 0) && (pBVar2 != (Block *)0x0)) &&
     (bVar1 = IString::isNull(&(pBVar2->name).super_IString), bVar1)) {
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pBVar2->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _expression = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                            (&(pBVar2->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end2.index,(Iterator *)&expression), bVar1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end2.index);
      printFullLine(this,*ppEVar3);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end2.index);
    }
  }
  else {
    printFullLine(this,curr);
  }
  return;
}

Assistant:

void PrintSExpression::maybePrintImplicitBlock(Expression* curr) {
  auto block = curr->dynCast<Block>();
  if (!full && block && block->name.isNull()) {
    for (auto expression : block->list) {
      printFullLine(expression);
    }
  } else {
    printFullLine(curr);
  }
}